

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pscp.c
# Opt level: O0

int scp_send_filetimes(unsigned_long mtime,unsigned_long atime)

{
  Backend *be;
  size_t len;
  char local_78 [8];
  char buf [80];
  unsigned_long atime_local;
  unsigned_long mtime_local;
  
  if (using_sftp) {
    scp_has_times = true;
    mtime_local._4_4_ = 0;
    scp_sftp_mtime = mtime;
    scp_sftp_atime = atime;
  }
  else {
    sprintf(local_78,"T%lu 0 %lu 0\n",mtime,atime);
    be = backend;
    len = strlen(local_78);
    backend_send(be,local_78,len);
    mtime_local._4_4_ = response();
  }
  return mtime_local._4_4_;
}

Assistant:

int scp_send_filetimes(unsigned long mtime, unsigned long atime)
{
    if (using_sftp) {
        scp_sftp_mtime = mtime;
        scp_sftp_atime = atime;
        scp_has_times = true;
        return 0;
    } else {
        char buf[80];
        sprintf(buf, "T%lu 0 %lu 0\n", mtime, atime);
        backend_send(backend, buf, strlen(buf));
        return response();
    }
}